

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

void jsoncons::detail::dump_buffer<jsoncons::string_sink<std::__cxx11::string>>
               (char *buffer,size_t length,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  bool bVar1;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar2;
  char in_DL;
  long in_RSI;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char *q;
  bool needs_dot;
  char *send;
  char *sbeg;
  int in_stack_ffffffffffffffbc;
  char ch;
  value_type ch_00;
  
  psVar2 = (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&in_RDI->buf_ptr + in_RSI);
  if (in_RDI != psVar2) {
    bVar1 = true;
    for (; in_RDI < psVar2;
        in_RDI = (string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&in_RDI->buf_ptr + 1)) {
      in_stack_ffffffffffffffbc = (int)*(char *)&in_RDI->buf_ptr;
      ch = *(char *)&in_RDI->buf_ptr >> 7;
      if (((in_stack_ffffffffffffffbc == 0x2b) || (in_stack_ffffffffffffffbc == 0x2d)) ||
         (in_stack_ffffffffffffffbc - 0x30U < 10)) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(in_RDI,ch);
      }
      else if ((in_stack_ffffffffffffffbc == 0x45) || (in_stack_ffffffffffffffbc == 0x65)) {
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(in_RDI,ch);
        bVar1 = false;
      }
      else if (*(char *)&in_RDI->buf_ptr == in_DL) {
        bVar1 = false;
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(in_RDI,ch);
      }
    }
    if (bVar1) {
      ch_00 = (value_type)((uint)in_stack_ffffffffffffffbc >> 0x18);
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(in_RDI,ch_00);
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(in_RDI,ch_00);
    }
  }
  return;
}

Assistant:

void dump_buffer(const char *buffer, std::size_t length, char decimal_point, Result& result)
    {
        const char *sbeg = buffer;
        const char *send = sbeg + length;

        if (sbeg != send)
        {
            bool needs_dot = true;
            for (const char* q = sbeg; q < send; ++q)
            {
                switch (*q)
                {
                case '-':
                case '0':
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9':
                case '+':
                    result.push_back(*q);
                    break;
                case 'e':
                case 'E':
                    result.push_back('e');
                    needs_dot = false;
                    break;
                default:
                    if (*q == decimal_point)
                    {
                        needs_dot = false;
                        result.push_back('.');
                    }
                    break;
                }
            }
            if (needs_dot)
            {
                result.push_back('.');
                result.push_back('0');
            }
        }
    }